

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void VP8LClear(VP8LDecoder *dec)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != 0) {
    ClearMetadata((VP8LMetadata *)0x10e807);
    WebPSafeFree((void *)0x10e815);
    *(undefined8 *)(in_RDI + 0x18) = 0;
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x110); local_c = local_c + 1) {
      ClearTransform((VP8LTransform *)0x10e858);
    }
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    WebPSafeFree((void *)0x10e894);
    *(undefined8 *)(in_RDI + 0x180) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

static void VP8LClear(VP8LDecoder* const dec) {
  int i;
  if (dec == NULL) return;
  ClearMetadata(&dec->hdr);

  WebPSafeFree(dec->pixels);
  dec->pixels = NULL;
  for (i = 0; i < dec->next_transform; ++i) {
    ClearTransform(&dec->transforms[i]);
  }
  dec->next_transform = 0;
  dec->transforms_seen = 0;

  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = NULL;

  dec->output = NULL;   // leave no trace behind
}